

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

void * arrayobj_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_atom *extraout_RDX;
  t_atom *ptVar2;
  t_atom *ptVar3;
  t_symbol *ptVar4;
  t_symbol *ptVar5;
  int in_R9D;
  int in_stack_ffffffffffffffd8;
  int local_24;
  t_atom *local_20;
  
  ptVar3 = argv;
  if (argc == 0) {
    ptVar5 = (t_symbol *)0x0;
  }
  else {
    ptVar2 = argv;
    if (argv->a_type == A_SYMBOL) {
      ptVar5 = (t_symbol *)((argv->a_w).w_symbol)->s_name;
      if (((*(char *)&ptVar5->s_name != 'd') || (*(char *)((long)&ptVar5->s_name + 1) != '\0')) &&
         (iVar1 = strcmp((char *)ptVar5,"define"), ptVar2 = extraout_RDX, iVar1 != 0)) {
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"size");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_size_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"sum");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_sum_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"get");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_get_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        iVar1 = strcmp((char *)ptVar5,"set");
        if (iVar1 == 0) {
          local_24 = argc + -1;
          local_20 = argv + 1;
          pd_maininstance.pd_newest =
               (t_pd *)array_rangeop_new(array_set_class,(t_symbol *)&local_24,(int *)&local_20,
                                         (t_atom **)0x1,0,in_R9D,in_stack_ffffffffffffffd8);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"quantile");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_quantile_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"random");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_random_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"max");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_max_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        ptVar4 = ptVar5;
        iVar1 = strcmp((char *)ptVar5,"min");
        if (iVar1 == 0) {
          pd_maininstance.pd_newest = (t_pd *)array_min_new(ptVar4,argc + -1,argv + 1);
          return pd_maininstance.pd_newest;
        }
        pd_error((void *)0x0,"array %s: unknown function",ptVar5);
        pd_maininstance.pd_newest = (t_pd *)0x0;
        return (void *)0x0;
      }
      argc = argc - 1;
      ptVar3 = argv + 1;
    }
    ptVar5 = (t_symbol *)(ulong)(uint)argc;
    argv = ptVar2;
  }
  pd_maininstance.pd_newest = (t_pd *)array_define_new(ptVar5,(int)ptVar3,argv);
  return pd_maininstance.pd_newest;
}

Assistant:

static void *arrayobj_new(t_symbol *s, int argc, t_atom *argv)
{
    if (!argc || argv[0].a_type != A_SYMBOL)
        pd_this->pd_newest = array_define_new(s, argc, argv);
    else
    {
        const char *str = argv[0].a_w.w_symbol->s_name;
        if (!strcmp(str, "d") || !strcmp(str, "define"))
            pd_this->pd_newest = array_define_new(s, argc-1, argv+1);
        else if (!strcmp(str, "size"))
            pd_this->pd_newest = array_size_new(s, argc-1, argv+1);
        else if (!strcmp(str, "sum"))
            pd_this->pd_newest = array_sum_new(s, argc-1, argv+1);
        else if (!strcmp(str, "get"))
            pd_this->pd_newest = array_get_new(s, argc-1, argv+1);
        else if (!strcmp(str, "set"))
            pd_this->pd_newest = array_set_new(s, argc-1, argv+1);
        else if (!strcmp(str, "quantile"))
            pd_this->pd_newest = array_quantile_new(s, argc-1, argv+1);
        else if (!strcmp(str, "random"))
            pd_this->pd_newest = array_random_new(s, argc-1, argv+1);
        else if (!strcmp(str, "max"))
            pd_this->pd_newest = array_max_new(s, argc-1, argv+1);
        else if (!strcmp(str, "min"))
            pd_this->pd_newest = array_min_new(s, argc-1, argv+1);
        else
        {
            pd_error(0, "array %s: unknown function", str);
            pd_this->pd_newest = 0;
        }
    }
    return (pd_this->pd_newest);
}